

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spxlpbase_real.hpp
# Opt level: O0

number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
* soplex::
  MPSgetRHS<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,(boost::multiprecision::expression_template_option)0>>
            (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
             *left,number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                   *right)

{
  type_conflict5 tVar1;
  ulong *puVar2;
  SPxInternalCodeException *this;
  cpp_dec_float<200U,_int,_void> *in_RDX;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *in_RDI;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *rhsval;
  cpp_dec_float<200U,_int,_void> *in_stack_fffffffffffffe08;
  cpp_dec_float<200U,_int,_void> *in_stack_fffffffffffffe10;
  double in_stack_fffffffffffffe18;
  allocator *paVar3;
  allocator local_1a9;
  string local_1a8 [32];
  undefined1 local_188 [128];
  ulong local_108;
  undefined1 local_100 [152];
  undefined8 local_68;
  ulong *local_60;
  undefined1 *local_58;
  undefined8 local_50;
  undefined8 local_48;
  undefined1 *local_40;
  undefined8 local_10;
  ulong *local_8;
  
  boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::cpp_dec_float
            (in_stack_fffffffffffffe10);
  puVar2 = (ulong *)infinity();
  local_108 = *puVar2 ^ 0x8000000000000000;
  local_58 = local_100;
  local_60 = &local_108;
  local_68 = 0;
  local_8 = local_60;
  boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::cpp_dec_float<double>
            (in_RDX,in_stack_fffffffffffffe18,in_stack_fffffffffffffe10);
  tVar1 = boost::multiprecision::operator>
                    ((number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                      *)in_stack_fffffffffffffe08,
                     (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                      *)0x17001f);
  if (tVar1) {
    boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::operator=
              (in_stack_fffffffffffffe10,in_stack_fffffffffffffe08);
  }
  else {
    local_48 = infinity();
    local_40 = local_188;
    local_50 = 0;
    local_10 = local_48;
    boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::cpp_dec_float<double>
              (in_RDX,in_stack_fffffffffffffe18,in_stack_fffffffffffffe10);
    tVar1 = boost::multiprecision::operator<
                      ((number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                        *)in_stack_fffffffffffffe08,
                       (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                        *)0x1700bb);
    if (!tVar1) {
      this = (SPxInternalCodeException *)__cxa_allocate_exception(0x28);
      paVar3 = &local_1a9;
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_1a8,"XMPSWR01 This should never happen.",paVar3);
      SPxInternalCodeException::SPxInternalCodeException(this,(string *)in_stack_fffffffffffffe08);
      __cxa_throw(this,&SPxInternalCodeException::typeinfo,
                  SPxInternalCodeException::~SPxInternalCodeException);
    }
    boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::operator=
              (in_stack_fffffffffffffe10,in_stack_fffffffffffffe08);
  }
  return in_RDI;
}

Assistant:

static R MPSgetRHS(R left, R right)
{
   R rhsval;

   if(left > R(-infinity))   /// This includes ranges
      rhsval = left;
   else if(right <  R(infinity))
      rhsval = right;
   else
      throw SPxInternalCodeException("XMPSWR01 This should never happen.");

   return rhsval;
}